

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O2

iterator __thiscall
absl::lts_20250127::
InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
::erase(InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
        *this,const_iterator pos)

{
  Data *pDVar1;
  const_iterator pPVar2;
  Iterator<std::allocator<absl::lts_20250127::status_internal::Payload>_> pPVar3;
  ulong uVar4;
  ulong uVar5;
  const_iterator pPVar6;
  anon_class_1_0_00000001 local_1a;
  anon_class_1_0_00000001 local_19;
  
  uVar4 = (this->storage_).metadata_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
          .super_Storage<unsigned_long,_1UL,_false>.value;
  pPVar2 = (this->storage_).data_.allocated.allocated_data;
  pDVar1 = &(this->storage_).data_;
  uVar5 = uVar4 & 1;
  pPVar6 = pPVar2;
  if (uVar5 == 0) {
    pPVar6 = (const_iterator)pDVar1;
  }
  if (pos < pPVar6) {
    erase::anon_class_1_0_00000001::operator()(&local_19);
    uVar4 = (this->storage_).metadata_.
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
            .super_Storage<unsigned_long,_1UL,_false>.value;
    pPVar2 = (this->storage_).data_.allocated.allocated_data;
    uVar5 = (ulong)((uint)uVar4 & 1);
  }
  if (uVar5 == 0) {
    pPVar2 = (const_iterator)pDVar1;
  }
  if (pPVar2 + (uVar4 >> 1) <= pos) {
    erase::anon_class_1_0_00000001::operator()(&local_1a);
  }
  pPVar3 = inlined_vector_internal::
           Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
           ::Erase(&this->storage_,pos,pos + 1);
  return pPVar3;
}

Assistant:

iterator erase(const_iterator pos) ABSL_ATTRIBUTE_LIFETIME_BOUND {
    ABSL_HARDENING_ASSERT(pos >= begin());
    ABSL_HARDENING_ASSERT(pos < end());

    // https://gcc.gnu.org/bugzilla/show_bug.cgi?id=102329#c2
    // It appears that GCC thinks that since `pos` is a const pointer and may
    // point to uninitialized memory at this point, a warning should be
    // issued. But `pos` is actually only used to compute an array index to
    // write to.
#if !defined(__clang__) && defined(__GNUC__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wmaybe-uninitialized"
#pragma GCC diagnostic ignored "-Wuninitialized"
#endif
    return storage_.Erase(pos, pos + 1);
#if !defined(__clang__) && defined(__GNUC__)
#pragma GCC diagnostic pop
#endif
  }